

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

ecs_iter_t *
ecs_query_iter_page(ecs_iter_t *__return_storage_ptr__,ecs_query_t *query,int32_t offset,
                   int32_t limit)

{
  ecs_world_t *world_00;
  int32_t iVar1;
  ecs_query_iter_t it;
  int32_t table_count;
  ecs_world_t *world;
  int32_t limit_local;
  int32_t offset_local;
  ecs_query_t *query_local;
  
  _ecs_assert(query != (ecs_query_t *)0x0,2,(char *)0x0,"query != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x923);
  if (query == (ecs_query_t *)0x0) {
    __assert_fail("query != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x923,"ecs_iter_t ecs_query_iter_page(ecs_query_t *, int32_t, int32_t)");
  }
  _ecs_assert((_Bool)(((query->flags & 0x200) != 0 ^ 0xffU) & 1),2,(char *)0x0,
              "!(query->flags & EcsQueryIsOrphaned)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x924);
  if ((query->flags & 0x200) == 0) {
    world_00 = query->world;
    if ((query->needs_reorder & 1U) != 0) {
      order_ranked_tables(world_00,query);
    }
    sort_tables(world_00,query);
    if (((world_00->in_progress & 1U) == 0) && ((query->flags & 0x40) != 0)) {
      ecs_eval_component_monitors(world_00);
    }
    tables_reset_dirty(query);
    if (query->table_slices == (ecs_vector_t *)0x0) {
      it.sparse_first = ecs_vector_count(query->tables);
    }
    else {
      it.sparse_first = ecs_vector_count(query->table_slices);
    }
    memset(__return_storage_ptr__,0,0xe0);
    __return_storage_ptr__->world = world_00;
    __return_storage_ptr__->query = query;
    __return_storage_ptr__->table_count = it.sparse_first;
    iVar1 = ecs_vector_count(query->empty_tables);
    __return_storage_ptr__->inactive_table_count = iVar1;
    iVar1 = ecs_vector_count((query->sig).columns);
    __return_storage_ptr__->column_count = iVar1;
    (__return_storage_ptr__->iter).parent.filter.include = (ecs_type_t)CONCAT44(limit,offset);
    *(ulong *)((long)&__return_storage_ptr__->iter + 8) = (ulong)(uint)limit;
    *(ecs_match_kind_t *)((long)&__return_storage_ptr__->iter + 0x10) = EcsMatchDefault;
    *(ecs_match_kind_t *)((long)&__return_storage_ptr__->iter + 0x14) = EcsMatchDefault;
    (__return_storage_ptr__->iter).query.bitset_first = 0;
    return __return_storage_ptr__;
  }
  __assert_fail("!(query->flags & (512))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x924,"ecs_iter_t ecs_query_iter_page(ecs_query_t *, int32_t, int32_t)");
}

Assistant:

ecs_iter_t ecs_query_iter_page(
    ecs_query_t *query,
    int32_t offset,
    int32_t limit)
{
    ecs_assert(query != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(!(query->flags & EcsQueryIsOrphaned), ECS_INVALID_PARAMETER, NULL);

    ecs_world_t *world = query->world;

    if (query->needs_reorder) {
        order_ranked_tables(world, query);
    }
    
    sort_tables(world, query);

    if (!world->in_progress && query->flags & EcsQueryHasRefs) {
        ecs_eval_component_monitors(world);
    }

    tables_reset_dirty(query);

    int32_t table_count;
    if (query->table_slices) {
        table_count = ecs_vector_count(query->table_slices);
    } else {
        table_count = ecs_vector_count(query->tables);
    }

    ecs_query_iter_t it = {
        .page_iter = {
            .offset = offset,
            .limit = limit,
            .remaining = limit
        },
        .index = 0,
    };

    return (ecs_iter_t){
        .world = world,
        .query = query,
        .column_count = ecs_vector_count(query->sig.columns),
        .table_count = table_count,
        .inactive_table_count = ecs_vector_count(query->empty_tables),
        .iter.query = it
    };
}